

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_serializer.hpp
# Opt level: O2

void duckdb::BinarySerializer::Serialize<duckdb::LogicalOperator>
               (LogicalOperator *value,WriteStream *stream,SerializationOptions *options)

{
  BinarySerializer serializer;
  undefined1 local_580 [56];
  BinarySerializer local_548;
  
  SerializationOptions::SerializationOptions((SerializationOptions *)local_580,options);
  BinarySerializer(&local_548,stream,(SerializationOptions *)local_580);
  ::std::__cxx11::string::~string((string *)(local_580 + 8));
  OnObjectBegin(&local_548);
  (*value->_vptr_LogicalOperator[8])(value,&local_548);
  OnObjectEnd(&local_548);
  ~BinarySerializer(&local_548);
  return;
}

Assistant:

static void Serialize(const T &value, WriteStream &stream, SerializationOptions options = SerializationOptions()) {
		BinarySerializer serializer(stream, std::move(options));
		serializer.OnObjectBegin();
		value.Serialize(serializer);
		serializer.OnObjectEnd();
	}